

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O2

int xmlTextWriterWriteBinHex(xmlTextWriterPtr writer,char *data,int start,int len)

{
  xmlOutputBufferPtr out;
  int iVar1;
  int iVar2;
  int iVar3;
  xmlLinkPtr lk;
  xmlTextWriterStackEntry *p;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  
  if (-1 < (len | start) && (data != (char *)0x0 && writer != (xmlTextWriterPtr)0x0)) {
    lk = xmlListFront(writer->nodes);
    iVar1 = 0;
    if (((lk != (xmlLinkPtr)0x0) &&
        (p = (xmlTextWriterStackEntry *)xmlLinkGetData(lk), iVar1 = 0,
        p != (xmlTextWriterStackEntry *)0x0)) &&
       (iVar1 = xmlTextWriterHandleStateDependencies(writer,p), iVar1 < 0)) {
      return -1;
    }
    if (writer->indent != 0) {
      writer->doindent = 0;
    }
    out = writer->out;
    if (out != (xmlOutputBufferPtr)0x0) {
      uVar4 = 0;
      uVar5 = (ulong)(uint)len;
      if (len < 1) {
        uVar5 = uVar4;
      }
      iVar6 = 0;
      for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
        iVar2 = xmlOutputBufferWrite
                          (out,1,xmlOutputBufferWriteBinHex_hex +
                                 ((byte)data[uVar4 + (uint)start] >> 4));
        if (iVar2 == -1) {
          return -1;
        }
        iVar3 = xmlOutputBufferWrite
                          (out,1,xmlOutputBufferWriteBinHex_hex +
                                 ((byte)data[uVar4 + (uint)start] & 0xf));
        if (iVar3 == -1) {
          return -1;
        }
        iVar6 = iVar2 + iVar6 + iVar3;
      }
      if (-1 < iVar6) {
        return iVar6 + iVar1;
      }
    }
  }
  return -1;
}

Assistant:

int
xmlTextWriterWriteBinHex(xmlTextWriterPtr writer, const char *data,
                         int start, int len)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;

    if ((writer == NULL) || (data == NULL) || (start < 0) || (len < 0))
        return -1;

    sum = 0;
    lk = xmlListFront(writer->nodes);
    if (lk != 0) {
        p = (xmlTextWriterStackEntry *) xmlLinkGetData(lk);
        if (p != 0) {
            count = xmlTextWriterHandleStateDependencies(writer, p);
            if (count < 0)
                return -1;
            sum += count;
        }
    }

    if (writer->indent)
        writer->doindent = 0;

    count =
        xmlOutputBufferWriteBinHex(writer->out, len,
                                   (unsigned char *) data + start);
    if (count < 0)
        return -1;
    sum += count;

    return sum;
}